

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_2627f55::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  pointer *ppDVar1;
  pointer *ppPVar2;
  cmStateSnapshot *this_00;
  uint uVar3;
  _Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_> _Var4;
  pointer pDVar5;
  pointer pDVar6;
  pointer __first;
  cmMakefile *pcVar7;
  pointer puVar8;
  cmInstallGenerator *pcVar9;
  long *plVar10;
  ValueHolder *pVVar11;
  pointer pcVar12;
  cmFileAPI *this_01;
  undefined8 *puVar13;
  pointer pPVar14;
  cmState *pcVar15;
  size_type sVar16;
  undefined8 uVar17;
  pointer pPVar18;
  pointer pPVar19;
  bool bVar20;
  int iVar21;
  TargetType TVar22;
  ArrayIndex AVar23;
  Value *pVVar24;
  pointer __result;
  pointer pDVar25;
  pointer pDVar26;
  mapped_type_conflict3 *pmVar27;
  iterator iVar28;
  undefined1 *puVar29;
  ValueHolder VVar30;
  ulong uVar31;
  cmGlobalGenerator *pcVar32;
  string *psVar33;
  cmLocalGenerator *this_02;
  mapped_type *pmVar34;
  cmValue value;
  Value *this_03;
  _Tp_alloc_type *p_Var35;
  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *p_Var36;
  long lVar37;
  pointer pPVar38;
  ValueHolder *pVVar39;
  undefined8 uVar40;
  undefined1 *puVar41;
  _Alloc_hider this_04;
  undefined1 *puVar42;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  pointer puVar43;
  ValueHolder this_05;
  long *plVar44;
  long lVar45;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar46;
  undefined8 *puVar47;
  bool bVar48;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  cmStateSnapshot ps;
  string buildDir;
  string prefix_1;
  Value minimumCMakeVersion;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  string sourceDir;
  string buildDirRel;
  string prefix;
  Target t;
  string *local_540;
  ValueHolder local_538;
  ValueHolder VStack_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528 [3];
  ValueHolder local_4f8;
  string *local_4f0;
  string local_4e8;
  string local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498 [2];
  cmFileAPI *local_478;
  string *local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  pointer local_440;
  ValueHolder local_438;
  ValueHolder VStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [2];
  Value *local_408;
  ValueHolder local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  Value local_3d8;
  ValueHolder local_3b0;
  long local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  char *local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  string local_378;
  pointer local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  ValueHolder *local_340;
  pointer local_338;
  long local_330;
  ValueHolder local_328;
  ValueHolder VStack_320;
  undefined1 local_318 [8];
  undefined1 local_310 [32];
  ValueHolder local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [8];
  undefined1 local_2d8 [24];
  BacktraceData local_2c0;
  _Rb_tree_node_base local_178;
  undefined8 local_158;
  _Base_ptr *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_130;
  undefined8 local_128;
  _Base_ptr p_Stack_120;
  Value local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  undefined8 uStack_b0;
  undefined8 local_a8;
  _Alloc_hider *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined8 local_78;
  _Alloc_hider _Stack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_408 = __return_storage_ptr__;
  Json::Value::Value((Value *)&local_328,this->Config);
  pVVar24 = Json::Value::operator[](__return_storage_ptr__,"name");
  pVVar39 = &local_328;
  Json::Value::operator=(pVVar24,(Value *)&local_328);
  Json::Value::~Value((Value *)&local_328);
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  p_Var36 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)(*(long *)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl
                         + 0xa0) -
                *(long *)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl
                         + 0x98) >> 3);
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)0x199999999999999 < p_Var36) {
    local_388 = "vector::reserve";
LAB_005b66eb:
    std::__throw_length_error(local_388);
  }
  pDVar25 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var35 = (_Tp_alloc_type *)0xcccccccccccccccd;
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)(((long)(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar25 >> 4) *
         -0x3333333333333333) < p_Var36) {
    pDVar5 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ::_M_allocate(p_Var36,(size_t)pVVar39);
    pVVar39 = (ValueHolder *)
              (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::_S_relocate((this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start,(pointer)pVVar39,__result,p_Var35);
    pDVar6 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pDVar6 != (pointer)0x0) {
      pVVar39 = (ValueHolder *)
                ((long)(this->Directories).
                       super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar6);
      operator_delete(pDVar6,(ulong)pVVar39);
    }
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pDVar5 - (long)pDVar25) + (long)__result);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)p_Var36;
  }
  local_540 = *(string **)
               ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x98);
  local_470 = *(string **)
               ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0xa0);
  if (local_540 != local_470) {
    local_4f0 = (string *)&this->DirectoryMap;
    local_440 = (pointer)&this->ProjectMap;
    local_478 = (cmFileAPI *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    local_330 = 0x7fffffffffffffd0;
    local_388 = "vector::_M_realloc_insert";
    do {
      __first = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar26 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar37 = (long)pDVar26 - (long)__first;
      local_4f8.int_ = (lVar37 >> 4) * -0x3333333333333333;
      if (pDVar26 ==
          (this->Directories).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar37 == local_330) goto LAB_005b66eb;
        VVar30.int_ = local_4f8.int_;
        if (pDVar26 == __first) {
          VVar30.int_ = (LargestInt)&DAT_00000001;
        }
        p_Var36 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   *)(VVar30.string_ + (long)local_4f8.string_);
        p_Var35 = (_Tp_alloc_type *)0x199999999999999;
        if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)0x199999999999998 < p_Var36) {
          p_Var36 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        if (CARRY8(VVar30.uint_,local_4f8.uint_)) {
          p_Var36 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        pDVar25 = std::
                  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_M_allocate(p_Var36,(size_t)pVVar39);
        this_00 = (cmStateSnapshot *)((long)pDVar25 + lVar37);
        puVar47 = (undefined8 *)((long)&pDVar25->TargetIndexes + lVar37 + 0x20);
        *puVar47 = 0;
        puVar47[1] = 0;
        puVar47 = (undefined8 *)((long)&pDVar25->TargetIndexes + lVar37 + 0x10);
        *puVar47 = 0;
        puVar47[1] = 0;
        puVar47 = (undefined8 *)((long)&pDVar25->TargetIndexes + lVar37);
        *puVar47 = 0;
        puVar47[1] = 0;
        puVar47 = (undefined8 *)((long)&pDVar25->Snapshot + lVar37 + 0x10);
        *puVar47 = 0;
        puVar47[1] = 0;
        *(undefined8 *)((long)pDVar25 + lVar37) = 0;
        ((undefined8 *)((long)pDVar25 + lVar37))[1] = 0;
        cmStateSnapshot::cmStateSnapshot(this_00,(cmState *)0x0);
        this_00[1].State = (cmState *)0x0;
        Json::Value::Value((Value *)&this_00[1].Position,arrayValue);
        *(undefined1 *)((long)&this_00[3].State + 4) = 0;
        pDVar26 = std::
                  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_S_relocate(__first,pDVar26,pDVar25,p_Var35);
        if (__first != (pointer)0x0) {
          operator_delete(__first,(long)(this->Directories).
                                        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first);
        }
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar25;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar26 + 1;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar25 + (long)p_Var36;
      }
      else {
        (pDVar26->TargetIndexes).limit_ = 0;
        pDVar26->ProjectIndex = 0;
        pDVar26->HasInstallRule = false;
        *(undefined3 *)&pDVar26->field_0x4d = 0;
        (pDVar26->TargetIndexes).comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)0x0;
        (pDVar26->TargetIndexes).start_ = 0;
        (pDVar26->TargetIndexes).value_.int_ = 0;
        *(undefined8 *)&(pDVar26->TargetIndexes).bits_ = 0;
        (pDVar26->Snapshot).Position.Position = 0;
        pDVar26->LocalGenerator = (cmLocalGenerator *)0x0;
        (pDVar26->Snapshot).State = (cmState *)0x0;
        (pDVar26->Snapshot).Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
        cmStateSnapshot::cmStateSnapshot(&pDVar26->Snapshot,(cmState *)0x0);
        pDVar26->LocalGenerator = (cmLocalGenerator *)0x0;
        Json::Value::Value(&pDVar26->TargetIndexes,arrayValue);
        pDVar26->HasInstallRule = false;
        ppDVar1 = &(this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      pVVar39 = (ValueHolder *)
                ((this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start + (local_4f8.uint_ & 0xffffffff));
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)&local_538,(cmLocalGenerator *)(local_540->_M_dataplus)._M_p);
      cmStateSnapshot::GetBuildsystemDirectory
                ((cmStateSnapshot *)&local_328,(cmStateSnapshot *)&local_538);
      pVVar39[2] = (ValueHolder)local_318;
      *pVVar39 = local_328;
      pVVar39[1] = VStack_320;
      pVVar39[3].map_ = (ObjectValues *)(local_540->_M_dataplus)._M_p;
      pmVar27 = std::
                map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                              *)local_4f0,(key_type *)pVVar39);
      *pmVar27 = (mapped_type_conflict3)local_4f8.int_;
      local_498[0]._0_8_ = pVVar39[2];
      local_4a8._M_allocated_capacity = (size_type)*pVVar39;
      local_4a8._8_8_ = pVVar39[1];
      uVar40 = &local_4a8;
      local_438 = (ValueHolder)local_4a8._M_allocated_capacity;
      VStack_430 = (ValueHolder)local_4a8._8_8_;
      local_428[0]._0_8_ = local_498[0]._0_8_;
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_538,(cmStateSnapshot *)uVar40);
      bVar20 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_538);
      if (bVar20) {
        cmStateSnapshot::GetProjectName_abi_cxx11_(&local_378,(cmStateSnapshot *)&local_538);
        uVar40 = &local_4a8;
        cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_50,(cmStateSnapshot *)uVar40);
        if (local_378._M_string_length != local_50._8_8_) goto LAB_005b4cc5;
        if (local_378._M_string_length == 0) {
          bVar48 = true;
        }
        else {
          uVar40 = local_50._M_allocated_capacity;
          iVar21 = bcmp(local_378._M_dataplus._M_p,(void *)local_50._M_allocated_capacity,
                        local_378._M_string_length);
          bVar48 = iVar21 == 0;
        }
      }
      else {
LAB_005b4cc5:
        bVar48 = false;
      }
      if (bVar20) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_allocated_capacity != &local_40) {
          uVar40 = local_40._M_allocated_capacity + 1;
          operator_delete((void *)local_50._M_allocated_capacity,uVar40);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          uVar40 = local_378.field_2._M_allocated_capacity + 1;
          operator_delete(local_378._M_dataplus._M_p,uVar40);
        }
      }
      if (bVar48) {
        local_318 = (undefined1  [8])local_528[0]._0_8_;
        local_328 = local_538;
        VStack_320 = VStack_530;
        iVar28 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                         *)local_4f0,(key_type *)&local_328);
        if ((cmFileAPI *)iVar28._M_node == local_478) goto LAB_005b66bd;
        AVar23 = (this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar28._M_node[1]._M_right].
                 ProjectIndex;
      }
      else {
        pPVar38 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pPVar14 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar37 = (long)pPVar14 - (long)pPVar38 >> 3;
        puVar41 = (undefined1 *)(lVar37 * -0x79435e50d79435e5);
        if (pPVar14 ==
            (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)pPVar14 - (long)pPVar38 == 0x7fffffffffffffc8) goto LAB_005b66eb;
          puVar29 = puVar41;
          if (pPVar14 == pPVar38) {
            puVar29 = &DAT_00000001;
          }
          puVar42 = puVar29 + (long)puVar41;
          if ((undefined1 *)0xd79435e50d7942 < puVar42) {
            puVar42 = (undefined1 *)0xd79435e50d7943;
          }
          if (CARRY8((ulong)puVar29,(ulong)puVar41)) {
            puVar42 = (undefined1 *)0xd79435e50d7943;
          }
          local_338 = pPVar14;
          if (puVar42 == (undefined1 *)0x0) {
            VVar30.int_ = 0;
          }
          else {
            VVar30.string_ = (char *)operator_new((long)puVar42 * 0x98);
          }
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)(VVar30.string_ + lVar37 * 8),(Project *)uVar40);
          pPVar18 = local_338;
          pPVar19 = pPVar38;
          local_400 = VVar30;
          pPVar14 = local_358;
          for (; local_358 = pPVar19, pPVar18 != pPVar38; pPVar38 = pPVar38 + 1) {
            pcVar15 = (pPVar38->Snapshot).State;
            pcVar7 = (cmMakefile *)(pPVar38->Snapshot).Position.Tree;
            uVar40 = *(undefined8 *)((long)&(pPVar38->Snapshot).Position.Position + 4);
            *(undefined8 *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(VVar30.map_)->_M_t)->_M_local_buf + 0xc) =
                 *(undefined8 *)((long)&(pPVar38->Snapshot).Position.Tree + 4);
            *(undefined8 *)((long)&(VVar30.map_)->_M_t + 0x14) = uVar40;
            *(cmState **)VVar30.string_ = pcVar15;
            *(cmMakefile **)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&(VVar30.map_)->_M_t)->_M_local_buf + 8) = pcVar7;
            local_350 = puVar42;
            local_348 = puVar41;
            local_340 = pVVar39;
            Json::Value::Value((Value *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                          *)&(VVar30.map_)->_M_t + 2),&pPVar38->ChildIndexes);
            Json::Value::Value((Value *)(VVar30.int_ + 0x48),&pPVar38->DirectoryIndexes);
            Json::Value::Value((Value *)(VVar30.int_ + 0x70),&pPVar38->TargetIndexes);
            Json::Value::~Value(&pPVar38->TargetIndexes);
            Json::Value::~Value(&pPVar38->DirectoryIndexes);
            Json::Value::~Value(&pPVar38->ChildIndexes);
            VVar30.string_ = (char *)(VVar30.int_ + 0x98);
            pVVar39 = local_340;
            pPVar19 = local_358;
            puVar41 = local_348;
            puVar42 = local_350;
            pPVar14 = local_358;
          }
          if (local_358 != (pointer)0x0) {
            uVar31 = (long)(this->Projects).
                           super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_358;
            pPVar38 = local_358;
            local_358 = pPVar14;
            operator_delete(pPVar38,uVar31);
            pPVar14 = local_358;
          }
          local_358 = pPVar14;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_400;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(VVar30.int_ + 0x98);
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(local_400.string_ + (long)puVar42 * 0x98);
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)pPVar14,(Project *)uVar40);
          ppPVar2 = &(this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar2 = *ppPVar2 + 1;
        }
        AVar23 = (ArrayIndex)puVar41;
        uVar31 = (ulong)puVar41 & 0xffffffff;
        pPVar38 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)&pPVar38[uVar31].Snapshot.Position.Position =
             local_498[0]._M_allocated_capacity;
        *(ValueHolder *)(pPVar38 + uVar31) = (ValueHolder)local_4a8._M_allocated_capacity;
        ((ValueHolder *)(pPVar38 + uVar31))[1] = (ValueHolder)local_4a8._8_8_;
        pmVar27 = std::
                  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                  ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                                *)local_440,(key_type *)&local_4a8);
        *pmVar27 = AVar23;
        bVar20 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_538);
        if (bVar20) {
          local_318 = (undefined1  [8])local_528[0]._0_8_;
          local_328 = local_538;
          VStack_320 = VStack_530;
          iVar28 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                           *)local_4f0,(key_type *)&local_328);
          if ((cmFileAPI *)iVar28._M_node == local_478) goto LAB_005b66bd;
          uVar3 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar28._M_node[1]._M_right].
                  ProjectIndex;
          pPVar38[uVar31].ParentIndex = uVar3;
          pPVar38 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value((Value *)&local_328,AVar23);
          Json::Value::append(&pPVar38[uVar3].ChildIndexes,(Value *)&local_328);
          Json::Value::~Value((Value *)&local_328);
        }
      }
      *(ArrayIndex *)(pVVar39 + 9) = AVar23;
      pPVar38 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&local_328,(UInt)local_4f8.uint_);
      pVVar39 = &local_328;
      Json::Value::append(&pPVar38[AVar23].DirectoryIndexes,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      local_540 = (string *)&local_540->_M_string_length;
    } while (local_540 != local_470);
  }
  pDVar25 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar25 !=
      (this->Directories).
      super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar7 = (pDVar25[-1].LocalGenerator)->Makefile;
      puVar8 = (pcVar7->InstallGenerators).
               super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar43 = (pcVar7->InstallGenerators).
                     super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar43 != puVar8;
          puVar43 = puVar43 + 1) {
        pcVar9 = (puVar43->_M_t).
                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
        if ((pcVar9 == (cmInstallGenerator *)0x0) ||
           (lVar37 = __dynamic_cast(pcVar9,&cmInstallGenerator::typeinfo,
                                    &cmInstallSubdirectoryGenerator::typeinfo,0), lVar37 == 0)) {
          pDVar25[-1].HasInstallRule = true;
          break;
        }
      }
      pDVar5 = pDVar25 + -1;
      if (pDVar25[-1].HasInstallRule == false) {
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_538,
                   &pDVar5->Snapshot);
        VVar30 = VStack_530;
        for (this_05 = local_538; this_05.int_ != VVar30.int_;
            this_05.string_ = (char *)((long)&(this_05.map_)->_M_t + 0x18)) {
          cmStateSnapshot::GetBuildsystemDirectory
                    ((cmStateSnapshot *)&local_4a8,(cmStateSnapshot *)this_05.map_);
          local_318 = (undefined1  [8])local_498[0]._0_8_;
          local_328 = (ValueHolder)local_4a8._M_allocated_capacity;
          VStack_320 = (ValueHolder)local_4a8._8_8_;
          iVar28 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_328);
          if ((_Rb_tree_header *)iVar28._M_node ==
              &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header) goto LAB_005b66bd;
          if ((this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar28._M_node[1]._M_right].
              HasInstallRule == true) {
            pDVar25[-1].HasInstallRule = true;
            break;
          }
        }
        if (local_538 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_538.string_,local_528[0]._M_allocated_capacity - (long)local_538);
        }
      }
      pDVar25 = pDVar5;
    } while (pDVar5 != (this->Directories).
                       super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  Json::Value::Value(&local_3d8,arrayValue);
  local_468._M_allocated_capacity = 0;
  local_468._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_458._M_allocated_capacity = 0;
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  plVar44 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                      0x98);
  plVar10 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                      0xa0);
  if (plVar44 != plVar10) {
    do {
      pVVar11 = *(ValueHolder **)(*plVar44 + 0x150);
      for (pVVar39 = *(ValueHolder **)(*plVar44 + 0x148); pVVar39 != pVVar11; pVVar39 = pVVar39 + 1)
      {
        local_328 = *pVVar39;
        std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
        emplace_back<cmGeneratorTarget*>
                  ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)
                   local_468._M_local_buf,(cmGeneratorTarget **)&local_328.map_);
      }
      plVar44 = plVar44 + 1;
    } while (plVar44 != plVar10);
  }
  uVar17 = local_468._8_8_;
  uVar40 = local_468._M_allocated_capacity;
  if (local_468._M_allocated_capacity != local_468._8_8_) {
    lVar45 = local_468._8_8_ - local_468._0_8_;
    uVar31 = lVar45 >> 3;
    lVar37 = 0x3f;
    if (uVar31 != 0) {
      for (; uVar31 >> lVar37 == 0; lVar37 = lVar37 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
              (local_468._M_allocated_capacity,local_468._8_8_,((uint)lVar37 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar45 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (uVar40,uVar17);
    }
    else {
      paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(uVar40 + 0x80);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (uVar40,paVar46);
      for (; paVar46 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar17;
          paVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar46->_M_allocated_capacity + 1)) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (paVar46);
      }
    }
  }
  local_4f8.string_ = (char *)local_468._8_8_;
  if (local_468._M_allocated_capacity != local_468._8_8_) {
    local_4f0 = &this->TopBuild;
    local_470 = (string *)&this->DirectoryMap;
    local_478 = (cmFileAPI *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    local_440 = (pointer)&this->TargetIndexMap;
    uVar40 = local_468._M_allocated_capacity;
    do {
      VVar30 = (ValueHolder)*(ValueHolder *)uVar40;
      TVar22 = cmGeneratorTarget::GetType((cmGeneratorTarget *)VVar30.map_);
      if ((TVar22 != GLOBAL_TARGET) &&
         (bVar20 = cmGeneratorTarget::IsInBuildSystem((cmGeneratorTarget *)VVar30.map_), bVar20)) {
        AVar23 = Json::Value::size(&local_3d8);
        VStack_320 = (ValueHolder)this->Config;
        local_3f8._M_allocated_capacity = (size_type)VVar30;
        local_328 = VVar30;
        pcVar32 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar30.map_);
        psVar33 = cmake::GetHomeDirectory_abi_cxx11_(pcVar32->CMakeInstance);
        local_318 = (undefined1  [8])((long)local_310 + 8);
        pcVar12 = (psVar33->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_318,pcVar12,pcVar12 + psVar33->_M_string_length);
        pcVar32 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar30.map_);
        psVar33 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar32->CMakeInstance);
        local_310._24_8_ = &local_2e8;
        pcVar12 = (psVar33->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)local_310 + 0x18),pcVar12,pcVar12 + psVar33->_M_string_length);
        std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                  ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_2d8,
                   &(*(cmMakefile **)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&(local_328.map_)->_M_t)->_M_local_buf + 8))->SourceGroups);
        local_538.string_ = (char *)local_528;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_538,local_318,(char *)((long)local_318 + local_310._0_8_));
        BacktraceData::BacktraceData(&local_2c0,(string *)&local_538);
        if (local_538 != local_528) {
          operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
        }
        local_178._M_color = _S_red;
        local_178._M_parent = (_Base_ptr)0x0;
        local_178._M_left = &local_178;
        local_158 = 0;
        local_150 = &p_Stack_120;
        local_148 = 1;
        local_140 = 0;
        uStack_138 = 0;
        local_130 = 0x3f800000;
        local_128 = 0;
        p_Stack_120 = (_Base_ptr)0x0;
        local_178._M_right = local_178._M_left;
        Json::Value::Value(&local_118,arrayValue);
        local_f0 = &aStack_c0;
        local_e8 = &DAT_00000001;
        local_e0 = 0;
        uStack_d8 = 0;
        local_d0 = 0x3f800000;
        local_a8 = 0;
        aStack_c0._8_8_ = 0;
        uStack_b0 = 0;
        local_c8 = 0;
        aStack_c0._M_allocated_capacity = 0;
        local_a0 = &_Stack_70;
        local_98 = &DAT_00000001;
        local_90 = 0;
        uStack_88 = 0;
        local_80 = 0x3f800000;
        local_58 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        _Stack_70._M_p = (pointer)0x0;
        psVar33 = cmGeneratorTarget::GetName_abi_cxx11_
                            ((cmGeneratorTarget *)local_3f8._M_allocated_capacity);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_3b0,"target-",psVar33);
        if (local_3a8 != 0) {
          lVar37 = 0;
          do {
            if ((local_3b0.string_[lVar37] == '\\') || (local_3b0.string_[lVar37] == '/')) {
              local_3b0.string_[lVar37] = '_';
            }
            lVar37 = lVar37 + 1;
          } while (local_3a8 != lVar37);
        }
        if (this->Config->_M_string_length != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_538,"-",this->Config);
          std::__cxx11::string::_M_append((char *)&local_3b0.int_,local_538.uint_);
          if (local_538 != local_528) {
            operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
          }
        }
        this_01 = this->FileAPI;
        Target::Dump((Value *)&local_538,(Target *)&local_328);
        cmFileAPI::MaybeJsonFile
                  ((Value *)&local_438,this_01,(Value *)&local_538,(string *)&local_3b0);
        Json::Value::~Value((Value *)&local_538);
        psVar33 = cmGeneratorTarget::GetName_abi_cxx11_
                            ((cmGeneratorTarget *)local_3f8._M_allocated_capacity);
        Json::Value::Value((Value *)&local_4a8,psVar33);
        pVVar24 = Json::Value::operator[]((Value *)&local_438,"name");
        Json::Value::operator=(pVVar24,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        TargetId(&local_4e8,(cmGeneratorTarget *)local_3f8._M_allocated_capacity,local_4f0);
        Json::Value::Value((Value *)&local_4a8,&local_4e8);
        pVVar24 = Json::Value::operator[]((Value *)&local_438,"id");
        Json::Value::operator=(pVVar24,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,
                          (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
        }
        this_02 = cmGeneratorTarget::GetLocalGenerator
                            ((cmGeneratorTarget *)local_3f8._M_allocated_capacity);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_4c8,this_02);
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_4e8,(cmStateSnapshot *)&local_4c8);
        local_498[0]._M_allocated_capacity = local_4e8.field_2._M_allocated_capacity;
        local_4a8._M_allocated_capacity = (size_type)local_4e8._M_dataplus._M_p;
        local_4a8._8_8_ = local_4e8._M_string_length;
        iVar28 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                         *)local_470,(key_type *)&local_4a8);
        if ((cmFileAPI *)iVar28._M_node == local_478) goto LAB_005b66bd;
        uVar3 = *(uint *)&iVar28._M_node[1]._M_right;
        Json::Value::Value((Value *)&local_4a8,uVar3);
        pVVar24 = Json::Value::operator[]((Value *)&local_438,"directoryIndex");
        Json::Value::operator=(pVVar24,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        pDVar25 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_4a8,AVar23);
        Json::Value::append(&pDVar25[uVar3].TargetIndexes,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        uVar3 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].ProjectIndex;
        Json::Value::Value((Value *)&local_4a8,uVar3);
        pVVar24 = Json::Value::operator[]((Value *)&local_438,"projectIndex");
        Json::Value::operator=(pVVar24,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        pPVar38 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_4a8,AVar23);
        Json::Value::append(&pPVar38[uVar3].TargetIndexes,(Value *)&local_4a8);
        Json::Value::~Value((Value *)&local_4a8);
        pmVar34 = std::__detail::
                  _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_440,(key_type *)&local_3f8._M_allocated_capacity);
        *pmVar34 = AVar23;
        if (local_3b0 != &local_3a0) {
          operator_delete(local_3b0.string_,local_3a0._M_allocated_capacity + 1);
        }
        Target::~Target((Target *)&local_328);
        Json::Value::append(&local_3d8,(Value *)&local_438);
        Json::Value::~Value((Value *)&local_438);
      }
      uVar40 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&((ObjectValues *)uVar40)->_M_t)->_M_local_buf + 8;
    } while (uVar40 != local_4f8.int_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_allocated_capacity !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete((void *)local_468._M_allocated_capacity,
                    local_458._M_allocated_capacity - local_468._0_8_);
  }
  pVVar24 = Json::Value::operator[](local_408,"targets");
  Json::Value::operator=(pVVar24,&local_3d8);
  Json::Value::~Value(&local_3d8);
  Json::Value::Value((Value *)&local_3b0,arrayValue);
  pDVar25 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_440 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar25 != local_440) {
    local_4f0 = &this->TopSource;
    local_470 = &this->TopBuild;
    local_400.string_ = (char *)&this->TargetIndexMap;
    local_4f8.string_ = (char *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      local_4c8.field_2._M_allocated_capacity = 0x726f746365726964;
      local_4c8.field_2._M_local_buf[8] = 'y';
      local_4c8._M_string_length = 9;
      local_4c8.field_2._M_local_buf[9] = '\0';
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar25->Snapshot);
      psVar33 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_328);
      cmSystemTools::RelativeIfUnder((string *)&local_468,local_4f0,psVar33);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar25->Snapshot);
      psVar33 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_328);
      cmSystemTools::RelativeIfUnder((string *)&local_3f8,local_470,psVar33);
      bVar20 = cmsys::SystemTools::FileIsFullPath((string *)&local_3f8);
      if (bVar20) {
        bVar20 = cmsys::SystemTools::FileIsFullPath((string *)&local_468);
        if (!bVar20) {
          local_328.int_ = local_4c8._M_string_length;
          VStack_320.string_ = local_4c8._M_dataplus._M_p;
          local_318 = (undefined1  [8])0x0;
          local_538.int_ = 0;
          VStack_530.int_ = (LargestInt)&DAT_00000001;
          local_528[0]._0_8_ = local_528[0]._M_local_buf + 8;
          local_528[0]._M_local_buf[8] = '-';
          local_310._0_8_ = &DAT_00000001;
          local_310._16_8_ = 0;
          local_310._24_8_ = local_468._8_8_;
          local_2f0 = (ValueHolder)local_468._M_allocated_capacity;
          local_2e8 = 0;
          views._M_len = 3;
          views._M_array = (iterator)&local_328;
          local_310._8_8_ = local_528[0]._0_8_;
          cmCatViews((string *)&local_4a8,views);
          goto LAB_005b5b88;
        }
      }
      else {
        local_328.int_ = local_4c8._M_string_length;
        VStack_320.string_ = local_4c8._M_dataplus._M_p;
        local_318 = (undefined1  [8])0x0;
        local_538.int_ = 0;
        VStack_530.int_ = (LargestInt)&DAT_00000001;
        local_528[0]._0_8_ = local_528[0]._M_local_buf + 8;
        local_528[0]._M_local_buf[8] = '-';
        local_310._0_8_ = &DAT_00000001;
        local_310._16_8_ = 0;
        local_310._24_8_ = local_3f8._8_8_;
        local_2f0 = (ValueHolder)local_3f8._M_allocated_capacity;
        local_2e8 = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_328;
        local_310._8_8_ = local_528[0]._0_8_;
        cmCatViews((string *)&local_4a8,views_00);
LAB_005b5b88:
        std::__cxx11::string::operator=((string *)&local_4c8,(string *)local_4a8._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_allocated_capacity != local_498) {
          operator_delete((void *)local_4a8._M_allocated_capacity,
                          (ulong)(local_498[0]._M_allocated_capacity + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        lVar37 = 0;
        do {
          if ((local_4c8._M_dataplus._M_p[lVar37] == '\\') ||
             (local_4c8._M_dataplus._M_p[lVar37] == '/')) {
            local_4c8._M_dataplus._M_p[lVar37] = '.';
          }
          lVar37 = lVar37 + 1;
        } while (local_4c8._M_string_length != lVar37);
      }
      if (this->Config->_M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_328,"-",this->Config);
        std::__cxx11::string::_M_append((char *)&local_4c8,local_328.uint_);
        if (local_328 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318) {
          operator_delete(local_328.string_,(ulong)((long)local_318 + 1));
        }
      }
      VVar30 = (ValueHolder)pDVar25->LocalGenerator;
      VStack_320 = (ValueHolder)this->Config;
      local_318 = (undefined1  [8])local_400;
      local_328 = VVar30;
      psVar33 = cmake::GetHomeDirectory_abi_cxx11_
                          ((cmake *)(*(_Base_ptr *)(VVar30.int_ + 0x88))[3]._M_right);
      local_310._0_8_ = (long)local_310 + 0x10;
      pcVar12 = (psVar33->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_318 + 8),pcVar12,pcVar12 + psVar33->_M_string_length);
      psVar33 = cmake::GetHomeOutputDirectory_abi_cxx11_
                          ((cmake *)(*(_Base_ptr *)(VVar30.int_ + 0x88))[3]._M_right);
      local_2f0.string_ = local_2e0;
      pcVar12 = (psVar33->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2f0,pcVar12,pcVar12 + psVar33->_M_string_length);
      local_538.string_ = (char *)local_528;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,local_310._0_8_,(char *)(local_310._8_8_ + local_310._0_8_));
      BacktraceData::BacktraceData((BacktraceData *)(local_2d8 + 8),(string *)&local_538);
      if (local_538 != local_528) {
        operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
      }
      local_478 = this->FileAPI;
      Json::Value::Value((Value *)&local_438,objectValue);
      Json::Value::Value((Value *)&local_4a8,objectValue);
      psVar33 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_328.map_);
      cmSystemTools::RelativeIfUnder(&local_4e8,(string *)(local_318 + 8),psVar33);
      Json::Value::Value((Value *)&local_538,&local_4e8);
      pVVar24 = Json::Value::operator[]((Value *)&local_4a8,"source");
      Json::Value::operator=(pVVar24,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
      }
      psVar33 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_328.map_);
      cmSystemTools::RelativeIfUnder(&local_4e8,(string *)&local_2f0,psVar33);
      Json::Value::Value((Value *)&local_538,&local_4e8);
      pVVar24 = Json::Value::operator[]((Value *)&local_4a8,"build");
      Json::Value::operator=(pVVar24,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
      }
      pVVar24 = Json::Value::operator[]((Value *)&local_438,"paths");
      Json::Value::operator=(pVVar24,(Value *)&local_4a8);
      Json::Value::~Value((Value *)&local_4a8);
      Json::Value::Value((Value *)&local_4a8,arrayValue);
      puVar13 = *(undefined8 **)
                 (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_328.int_ + 0x70))->_M_allocated_capacity + 0x220);
      for (puVar47 = *(undefined8 **)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_328.int_ + 0x70))->_M_allocated_capacity + 0x218);
          puVar47 != puVar13; puVar47 = puVar47 + 1) {
        DirectoryObject::DumpInstaller
                  ((Value *)&local_538,(DirectoryObject *)&local_328,(cmInstallGenerator *)*puVar47)
        ;
        bVar20 = Json::Value::empty((Value *)&local_538);
        if (!bVar20) {
          Json::Value::append((Value *)&local_4a8,(Value *)&local_538);
        }
        Json::Value::~Value((Value *)&local_538);
      }
      pVVar24 = Json::Value::operator[]((Value *)&local_438,"installers");
      Json::Value::operator=(pVVar24,(Value *)&local_4a8);
      Json::Value::~Value((Value *)&local_4a8);
      BacktraceData::Dump((Value *)&local_538,(BacktraceData *)(local_2d8 + 8));
      pVVar24 = Json::Value::operator[]((Value *)&local_438,"backtraceGraph");
      Json::Value::operator=(pVVar24,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      cmFileAPI::MaybeJsonFile(&local_3d8,local_478,(Value *)&local_438,&local_4c8);
      Json::Value::~Value((Value *)&local_438);
      DirectoryObject::~DirectoryObject((DirectoryObject *)&local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_allocated_capacity != &local_3e8) {
        operator_delete((void *)local_3f8._M_allocated_capacity,
                        (ulong)(local_3e8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_allocated_capacity != &local_458) {
        operator_delete((void *)local_468._M_allocated_capacity,
                        (ulong)(local_458._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar25->Snapshot);
      psVar33 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_328);
      local_438.string_ = (char *)local_428;
      pcVar12 = (psVar33->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438,pcVar12,pcVar12 + psVar33->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_538,local_4f0,(string *)&local_438);
      Json::Value::Value((Value *)&local_328,(String *)&local_538);
      pVVar24 = Json::Value::operator[](&local_3d8,"source");
      Json::Value::operator=(pVVar24,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      if (local_538 != local_528) {
        operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_328,&pDVar25->Snapshot);
      psVar33 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_328);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      pcVar12 = (psVar33->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e8,pcVar12,pcVar12 + psVar33->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_538,local_470,&local_4e8);
      Json::Value::Value((Value *)&local_328,(String *)&local_538);
      pVVar24 = Json::Value::operator[](&local_3d8,"build");
      Json::Value::operator=(pVVar24,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      if (local_538 != local_528) {
        operator_delete(local_538.string_,(ulong)(local_528[0]._M_allocated_capacity + 1));
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_468,&pDVar25->Snapshot);
      bVar20 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_468);
      if (bVar20) {
        local_528[0]._M_allocated_capacity = local_458._M_allocated_capacity;
        local_538 = (ValueHolder)local_468._M_allocated_capacity;
        VStack_530 = (ValueHolder)local_468._8_8_;
        iVar28 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_538);
        if (iVar28._M_node == local_4f8) {
LAB_005b66bd:
          __assert_fail("i != this->DirectoryMap.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFileAPICodemodel.cxx"
                        ,0x280,
                        "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
                       );
        }
        Json::Value::Value((Value *)&local_328,*(UInt *)&iVar28._M_node[1]._M_right);
        pVVar24 = Json::Value::operator[](&local_3d8,"parentIndex");
        Json::Value::operator=(pVVar24,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      Json::Value::Value((Value *)&local_538,arrayValue);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_4c8,
                 &pDVar25->Snapshot);
      sVar16 = local_4c8._M_string_length;
      for (this_04._M_p = local_4c8._M_dataplus._M_p; this_04._M_p != (pointer)sVar16;
          this_04._M_p = this_04._M_p + 0x18) {
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_3f8,(cmStateSnapshot *)this_04._M_p);
        local_498[0]._M_allocated_capacity = local_3e8._M_allocated_capacity;
        local_4a8._M_allocated_capacity = local_3f8._M_allocated_capacity;
        local_4a8._8_8_ = local_3f8._8_8_;
        iVar28 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_4a8);
        if (iVar28._M_node == local_4f8) goto LAB_005b66bd;
        Json::Value::Value((Value *)&local_328,*(UInt *)&iVar28._M_node[1]._M_right);
        Json::Value::append((Value *)&local_538,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_4c8._M_dataplus._M_p,
                        local_4c8.field_2._M_allocated_capacity - (long)local_4c8._M_dataplus._M_p);
      }
      bVar20 = Json::Value::empty((Value *)&local_538);
      if (!bVar20) {
        pVVar24 = Json::Value::operator[](&local_3d8,"childIndexes");
        Json::Value::operator=(pVVar24,(Value *)&local_538);
      }
      Json::Value::Value((Value *)&local_328,pDVar25->ProjectIndex);
      pVVar24 = Json::Value::operator[](&local_3d8,"projectIndex");
      Json::Value::operator=(pVVar24,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      bVar20 = Json::Value::empty(&pDVar25->TargetIndexes);
      if (!bVar20) {
        pVVar24 = Json::Value::operator[](&local_3d8,"targetIndexes");
        Json::Value::operator=(pVVar24,&pDVar25->TargetIndexes);
      }
      local_4c8.field_2._M_allocated_capacity = (pDVar25->Snapshot).Position.Position;
      local_4c8._M_dataplus._M_p = (pointer)(pDVar25->Snapshot).State;
      local_4c8._M_string_length = (size_type)(pDVar25->Snapshot).Position.Tree;
      Json::Value::Value((Value *)&local_4a8,nullValue);
      local_328.string_ = local_318;
      local_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&DAT_0000001e;
      local_328.int_ = std::__cxx11::string::_M_create(&local_328.uint_,(ulong)&local_380);
      local_318 = (undefined1  [8])local_380;
      (((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header.field_0x6 = 'R';
      (((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header.field_0x7 = 'E';
      *(char *)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent = 'Q';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 1) = 'U';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 2) = 'I';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 3) = 'R';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 4) = 'E';
      *(char *)((long)&(((_Rep_type *)local_328)->_M_impl).super__Rb_tree_header._M_header._M_parent
               + 5) = 'D';
      builtin_strncpy((char *)((long)&(local_328.map_)->_M_t + 0x16),"_VERSION",8);
      builtin_strncpy((char *)local_328,"CMAKE_MI",8);
      *(undefined8 *)
       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)&(local_328.map_)->_M_t)->_M_local_buf + 8) = 0x45525f4d554d494e;
      VStack_320.int_ = (LargestInt)local_380;
      local_328.string_[(long)local_380] = '\0';
      value = cmStateSnapshot::GetDefinition(&local_4c8,(string *)&local_328);
      if (local_328 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318) {
        operator_delete(local_328.string_,(ulong)((long)local_318 + 1));
      }
      if (value.Value != (string *)0x0) {
        Json::Value::Value((Value *)&local_328,objectValue);
        Json::Value::operator=((Value *)&local_4a8,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
        Json::Value::Value((Value *)&local_328,value.Value);
        pVVar24 = Json::Value::operator[]((Value *)&local_4a8,"string");
        Json::Value::operator=(pVVar24,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      bVar20 = Json::Value::isNull((Value *)&local_4a8);
      if (!bVar20) {
        pVVar24 = Json::Value::operator[](&local_3d8,"minimumCMakeVersion");
        Json::Value::operator=(pVVar24,(Value *)&local_4a8);
      }
      if (pDVar25->HasInstallRule == true) {
        Json::Value::Value((Value *)&local_328,true);
        pVVar24 = Json::Value::operator[](&local_3d8,"hasInstallRule");
        Json::Value::operator=(pVVar24,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      Json::Value::~Value((Value *)&local_4a8);
      Json::Value::~Value((Value *)&local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,
                        (ulong)(local_4e8.field_2._M_allocated_capacity + 1));
      }
      if (local_438 != local_428) {
        operator_delete(local_438.string_,(ulong)(local_428[0]._M_allocated_capacity + 1));
      }
      Json::Value::append((Value *)&local_3b0,&local_3d8);
      Json::Value::~Value(&local_3d8);
      pDVar25 = pDVar25 + 1;
    } while (pDVar25 != local_440);
  }
  pVVar24 = Json::Value::operator[](local_408,"directories");
  Json::Value::operator=(pVVar24,(Value *)&local_3b0);
  Json::Value::~Value((Value *)&local_3b0);
  Json::Value::Value((Value *)&local_4a8,arrayValue);
  pPVar38 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar14 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar38 != pPVar14) {
    do {
      Json::Value::Value((Value *)&local_538,objectValue);
      cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_438,&pPVar38->Snapshot);
      Json::Value::Value((Value *)&local_328,(String *)&local_438);
      pVVar24 = Json::Value::operator[]((Value *)&local_538,"name");
      Json::Value::operator=(pVVar24,(Value *)&local_328);
      Json::Value::~Value((Value *)&local_328);
      if (local_438 != local_428) {
        operator_delete(local_438.string_,(ulong)(local_428[0]._M_allocated_capacity + 1));
      }
      if (pPVar38->ParentIndex != 0xffffffff) {
        Json::Value::Value((Value *)&local_328,pPVar38->ParentIndex);
        pVVar24 = Json::Value::operator[]((Value *)&local_538,"parentIndex");
        Json::Value::operator=(pVVar24,(Value *)&local_328);
        Json::Value::~Value((Value *)&local_328);
      }
      bVar20 = Json::Value::empty(&pPVar38->ChildIndexes);
      if (!bVar20) {
        pVVar24 = Json::Value::operator[]((Value *)&local_538,"childIndexes");
        Json::Value::operator=(pVVar24,&pPVar38->ChildIndexes);
      }
      pVVar24 = Json::Value::operator[]((Value *)&local_538,"directoryIndexes");
      Json::Value::operator=(pVVar24,&pPVar38->DirectoryIndexes);
      bVar20 = Json::Value::empty(&pPVar38->TargetIndexes);
      if (!bVar20) {
        pVVar24 = Json::Value::operator[]((Value *)&local_538,"targetIndexes");
        Json::Value::operator=(pVVar24,&pPVar38->TargetIndexes);
      }
      Json::Value::append((Value *)&local_4a8,(Value *)&local_538);
      Json::Value::~Value((Value *)&local_538);
      pPVar38 = pPVar38 + 1;
    } while (pPVar38 != pPVar14);
  }
  pVVar24 = local_408;
  this_03 = Json::Value::operator[](local_408,"projects");
  Json::Value::operator=(this_03,(Value *)&local_4a8);
  Json::Value::~Value((Value *)&local_4a8);
  return pVVar24;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}